

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O0

void __thiscall
agge::tests::RendererTests::RendererAdapterShiftsPixelsCoordinatesAccordinglyToTheOffset
          (RendererTests *this)

{
  agge_vector<int> offset;
  size_type __n;
  allocator local_2a1;
  string local_2a0 [32];
  LocationInfo local_280;
  int aiStack_258 [2];
  int reference2 [35];
  undefined1 local_1c0 [8];
  renderer_adapter r2;
  string local_180 [32];
  LocationInfo local_160;
  int local_138 [2];
  int reference1 [35];
  undefined1 local_98 [8];
  renderer_adapter r1;
  undefined1 local_50 [8];
  bitmap<int,_0UL,_0UL> bitmap;
  blender<int,_unsigned_char> blender;
  uint8_t covers [5];
  RendererTests *this_local;
  
  blender.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0x79;
  blender.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0xe3f71910;
  tests::mocks::blender<int,_unsigned_char>::blender((blender<int,_unsigned_char> *)&bitmap._width);
  tests::mocks::bitmap<int,_0UL,_0UL>::bitmap((bitmap<int,_0UL,_0UL> *)local_50,7,5);
  offset = mkvector<int>(-3,-2);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
  ::adapter((adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
             *)local_98,(bitmap<int,_0UL,_0UL> *)local_50,offset,(rect_i *)0x0,
            (blender<int,_unsigned_char> *)&bitmap._width);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
  ::set_y((adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
           *)local_98,-1);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
  ::operator()((adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
                *)local_98,-2,3,
               (cover_type *)
               &blender.filling_log.
                super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
  ::set_y((adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
           *)local_98,1);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
  ::operator()((adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
                *)local_98,0,2,
               (cover_type *)
               &blender.filling_log.
                super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
  ::set_y((adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
           *)local_98,2);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
  ::operator()((adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
                *)local_98,1,3,
               (cover_type *)
               &blender.filling_log.
                super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  memcpy(local_138,&DAT_0029f5b0,0x8c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_180,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,(allocator *)&r2.field_0x37);
  ut::LocationInfo::LocationInfo(&local_160,(string *)local_180,0x2ec);
  ut::are_equal<int,35ul,std::vector<int,std::allocator<int>>>
            ((int (*) [35])local_138,(vector<int,_std::allocator<int>_> *)local_50,&local_160);
  ut::LocationInfo::~LocationInfo(&local_160);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&r2.field_0x37);
  __n = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)local_50);
  r2._y = 0;
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)local_50,__n,&r2._y);
  register0x00000000 = mkvector<int>(0x50,0x30);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
  ::adapter((adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
             *)local_1c0,(bitmap<int,_0UL,_0UL> *)local_50,register0x00000000,(rect_i *)0x0,
            (blender<int,_unsigned_char> *)&bitmap._width);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
  ::set_y((adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
           *)local_1c0,0x30);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
  ::operator()((adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_unsigned_char>_>
                *)local_1c0,0x50,4,
               (cover_type *)
               &blender.filling_log.
                super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  reference2[0x1e] = 0;
  reference2[0x1f] = 0;
  reference2[0x20] = 0;
  reference2[0x1a] = 0;
  reference2[0x1b] = 0;
  reference2[0x1c] = 0;
  reference2[0x1d] = 0;
  reference2[0x16] = 0;
  reference2[0x17] = 0;
  reference2[0x18] = 0;
  reference2[0x19] = 0;
  reference2[0x12] = 0;
  reference2[0x13] = 0;
  reference2[0x14] = 0;
  reference2[0x15] = 0;
  reference2[0xe] = 0;
  reference2[0xf] = 0;
  reference2[0x10] = 0;
  reference2[0x11] = 0;
  reference2[10] = 0;
  reference2[0xb] = 0;
  reference2[0xc] = 0;
  reference2[0xd] = 0;
  reference2[6] = 0;
  reference2[7] = 0;
  reference2[8] = 0;
  reference2[9] = 0;
  reference2[2] = 0;
  reference2[3] = 0;
  reference2[4] = 0;
  reference2[5] = 0;
  aiStack_258[0] = 0x305010;
  aiStack_258[1] = 0x305019;
  reference2[0] = 0x3050f7;
  reference2[1] = 0x3050e3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2a0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_2a1);
  ut::LocationInfo::LocationInfo(&local_280,(string *)local_2a0,0x301);
  ut::are_equal<int,35ul,std::vector<int,std::allocator<int>>>
            ((int (*) [35])aiStack_258,(vector<int,_std::allocator<int>_> *)local_50,&local_280);
  ut::LocationInfo::~LocationInfo(&local_280);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  tests::mocks::bitmap<int,_0UL,_0UL>::~bitmap((bitmap<int,_0UL,_0UL> *)local_50);
  tests::mocks::blender<int,_unsigned_char>::~blender((blender<int,_unsigned_char> *)&bitmap._width)
  ;
  return;
}

Assistant:

test( RendererAdapterShiftsPixelsCoordinatesAccordinglyToTheOffset )
			{
				// INIT
				uint8_t covers[] = { 0x10, 0x19, 0xF7, 0xE3, 0x79, };
				mocks::blender<int, uint8_t> blender;
				mocks::bitmap<int> bitmap(7, 5);

				typedef renderer::adapter< mocks::bitmap<int>, mocks::blender<int, uint8_t> > renderer_adapter;

				// INIT / ACT
				renderer_adapter r1(bitmap, mkvector(-3, -2), 0, blender);

				// ACT
				r1.set_y(-1);
				r1(-2, 3, covers);
				
				r1.set_y(1);
				r1(0, 2, covers);
				
				r1.set_y(2);
				r1(1, 3, covers);

				// ASSERT
				int reference1[] = {
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00FFFE10, 0x00FFFE19, 0x00FFFEF7, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00010010, 0x00010019, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00020110, 0x00020119, 0x000201F7,
				};

				assert_equal(reference1, bitmap.data);

				// INIT
				bitmap.data.assign(bitmap.data.size(), 0);

				// INIT / ACT
				renderer_adapter r2(bitmap, mkvector(0x50, 0x30), 0, blender);

				// ACT
				r2.set_y(0x30);
				r2(0x50, 4, covers);

				// ASSERT
				int reference2[] = {
					0x00305010, 0x00305019, 0x003050F7, 0x003050E3, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
				};

				assert_equal(reference2, bitmap.data);
			}